

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cappuccino::
tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::find(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *__return_storage_ptr__,
      tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      *this,unsigned_long *key,peek peek)

{
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> local_38;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> guard;
  time_point now;
  peek peek_local;
  unsigned_long *key_local;
  tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  guard._M_device = (mutex_type *)std::chrono::_V2::steady_clock::now();
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::lock_guard
            (&local_38,&this->m_lock);
  do_find(__return_storage_ptr__,this,key,(time_point)guard._M_device,peek);
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::~lock_guard
            (&local_38);
  return __return_storage_ptr__;
}

Assistant:

auto find(const key_type& key, peek peek = peek::no) -> std::optional<value_type>
    {
        auto now = std::chrono::steady_clock::now();

        std::lock_guard guard{m_lock};
        return do_find(key, now, peek);
    }